

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

int Rml::anon_unknown_0::GetNavigationHeuristic
              (BoundingBox *source,BoundingBox *target,NavigationSearchDirection direction)

{
  code *pcVar1;
  bool bVar2;
  anon_class_1_0_00000001 local_25;
  NavigationSearchDirection local_24;
  anon_class_1_0_00000001 CalculateHeuristic;
  BoundingBox *pBStack_20;
  NavigationSearchDirection direction_local;
  BoundingBox *target_local;
  BoundingBox *source_local;
  
  local_24 = direction;
  pBStack_20 = target;
  switch(direction) {
  case Up:
    source_local._4_4_ =
         GetNavigationHeuristic::anon_class_1_0_00000001::operator()
                   (&local_25,Vertical,source,target);
    break;
  case Down:
    source_local._4_4_ =
         GetNavigationHeuristic::anon_class_1_0_00000001::operator()
                   (&local_25,Vertical,target,source);
    break;
  case Left:
    source_local._4_4_ =
         GetNavigationHeuristic::anon_class_1_0_00000001::operator()
                   (&local_25,Horizontal,source,target);
    break;
  case Right:
    source_local._4_4_ =
         GetNavigationHeuristic::anon_class_1_0_00000001::operator()
                   (&local_25,Horizontal,target,source);
    break;
  default:
    bVar2 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementDocument.cpp"
                   ,0x80);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    source_local._4_4_ = 0x7fffffff;
  }
  return source_local._4_4_;
}

Assistant:

int GetNavigationHeuristic(const BoundingBox& source, const BoundingBox& target, NavigationSearchDirection direction)
	{
		enum Axis { Horizontal = 0, Vertical = 1 };

		auto CalculateHeuristic = [](Axis axis, const BoundingBox& a, const BoundingBox& b) -> int {
			// The heuristic is mainly the distance from the source to the target along the specified direction. In
			// addition, the following factor determines the penalty for being outside the projected area of the element in
			// the given direction, as a multiplier of the cross-axis distance between the target and projected area.
			static constexpr int CrossAxisFactor = 10'000;

			const int main_axis = int(a.min[axis] - b.max[axis]);
			if (main_axis < 0)
				return Infinite;

			const Axis cross = Axis((axis + 1) % 2);
			const int cross_axis = Math::Max(0, int(b.min[cross] - a.max[cross])) + Math::Max(0, int(a.min[cross] - b.max[cross]));

			return main_axis + CrossAxisFactor * cross_axis;
		};

		switch (direction)
		{
		case NavigationSearchDirection::Up: return CalculateHeuristic(Vertical, source, target);
		case NavigationSearchDirection::Down: return CalculateHeuristic(Vertical, target, source);
		case NavigationSearchDirection::Right: return CalculateHeuristic(Horizontal, target, source);
		case NavigationSearchDirection::Left: return CalculateHeuristic(Horizontal, source, target);
		}

		RMLUI_ERROR;
		return Infinite;
	}